

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O3

bool P_TestActivateLine(line_t_conflict *line,AActor *mo,int side,int activationType,
                       DVector3 *optpos)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = line->activation;
  if ((side == 1) && ((line->flags & 0x800000) != 0)) {
LAB_0045297b:
    bVar2 = false;
  }
  else {
    if ((uVar3 & 0x40) == 0) {
      if ((((line->special != 0x46) || (mo == (AActor *)0x0)) || (activationType != 0x20)) ||
         ((uVar3 & 1) == 0)) goto LAB_00452893;
      uVar4 = (mo->flags).Value >> 0xb & 0x20 | uVar3;
      uVar5 = uVar4 | 5;
      if (-1 < (char)uVar3) {
        uVar5 = uVar4;
      }
    }
    else {
      uVar3 = uVar3 | 2;
LAB_00452893:
      uVar5 = uVar3 | 5;
      if (-1 < (char)uVar3) {
        uVar5 = uVar3;
      }
      if (((activationType == 0x400) || (activationType == 2)) &&
         (bVar2 = P_CheckSwitchRange(mo,line,side,optpos), !bVar2)) goto LAB_0045297b;
      if (((activationType == 2) && ((uVar5 & 0x100) != 0)) &&
         ((mo->player == (player_t *)0x0 && (((mo->flags4).Value & 0x200) != 0)))) {
        return true;
      }
      if ((((activationType == 0x10) && ((uVar5 & 0x200) != 0)) && (mo->player == (player_t *)0x0))
         && (((mo->flags2).Value & 0x400000) != 0)) {
        return true;
      }
    }
    if ((uVar5 & activationType) == 0) {
      if (activationType != 4) {
        return false;
      }
      if (uVar5 != 1) {
        return false;
      }
    }
    else if (activationType == 0x80) {
      return true;
    }
    if (((mo == (AActor *)0x0) || (mo->player != (player_t *)0x0)) ||
       (((((mo->flags).Value & 0x10000) != 0 || ((line->flags >> 0xd & 1) != 0)) ||
        ((activationType == 4 && ((uVar5 & 4) != 0)))))) {
      if ((activationType == 4) && (((uVar5 & 4) == 0 && ((line->flags & 0x2000) == 0))))
      goto LAB_0045297b;
    }
    else {
      if (((byte)level.flags2 & 4) == 0) goto LAB_0045297b;
      if (activationType == 0x10) {
LAB_004529a6:
        if ((line->flags & 0x20) != 0) goto LAB_0045297b;
        if (activationType != 0x10) {
          if (activationType == 4) goto LAB_004529d9;
          if (activationType != 2) {
            return true;
          }
        }
        if (line->special - 0x46U < 2) {
          return true;
        }
        if ((line->special == 0xc) && (line->args[0] == 0)) {
          return line->args[1] < 0x40;
        }
        goto LAB_0045297b;
      }
      if (activationType != 4) {
        if (activationType != 2) {
          return true;
        }
        goto LAB_004529a6;
      }
LAB_004529d9:
      if ((uVar5 & 4) != 0) {
        return true;
      }
      iVar1 = line->special;
      if (iVar1 < 0x46) {
        if (iVar1 == 0xc) {
          if (0x3f < line->args[1]) goto LAB_0045297b;
        }
        else if (iVar1 != 0x3e) {
          return false;
        }
      }
      else if (((1 < iVar1 - 0x46U) && (iVar1 != 0xce)) && (iVar1 != 0xd7)) {
        return false;
      }
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool P_TestActivateLine (line_t *line, AActor *mo, int side, int activationType, DVector3 *optpos)
{
 	int lineActivation = line->activation;

	if (line->flags & ML_FIRSTSIDEONLY && side == 1)
	{
		return false;
	}

	if (lineActivation & SPAC_UseThrough)
	{
		lineActivation |= SPAC_Use;
	}
	else if (line->special == Teleport &&
		(lineActivation & SPAC_Cross) &&
		activationType == SPAC_PCross &&
		mo != NULL &&
		mo->flags & MF_MISSILE)
	{ // Let missiles use regular player teleports
		lineActivation |= SPAC_PCross;
	}
	// BOOM's generalized line types that allow monster use can actually be
	// activated by anything except projectiles.
	if (lineActivation & SPAC_AnyCross)
	{
		lineActivation |= SPAC_Cross|SPAC_MCross;
	}
	if (activationType == SPAC_Use || activationType == SPAC_UseBack)
	{
		if (!P_CheckSwitchRange(mo, line, side, optpos))
		{
			return false;
		}
	}

	if (activationType == SPAC_Use && (lineActivation & SPAC_MUse) && !mo->player && mo->flags4 & MF4_CANUSEWALLS)
	{
		return true;
	}
	if (activationType == SPAC_Push && (lineActivation & SPAC_MPush) && !mo->player && mo->flags2 & MF2_PUSHWALL)
	{
		return true;
	}
	if ((lineActivation & activationType) == 0)
	{
		if (activationType != SPAC_MCross || lineActivation != SPAC_Cross)
		{ 
			return false;
		}
	}
	if (activationType == SPAC_AnyCross && (lineActivation & activationType))
	{
		return true;
	}
	if (mo && !mo->player &&
		!(mo->flags & MF_MISSILE) &&
		!(line->flags & ML_MONSTERSCANACTIVATE) &&
		(activationType != SPAC_MCross || (!(lineActivation & SPAC_MCross))))
	{ 
		// [RH] monsters' ability to activate this line depends on its type
		// In Hexen, only MCROSS lines could be activated by monsters. With
		// lax activation checks, monsters can also activate certain lines
		// even without them being marked as monster activate-able. This is
		// the default for non-Hexen maps in Hexen format.
		if (!(level.flags2 & LEVEL2_LAXMONSTERACTIVATION))
		{
			return false;
		}
		if ((activationType == SPAC_Use || activationType == SPAC_Push)
			&& (line->flags & ML_SECRET))
			return false;		// never open secret doors

		bool noway = true;

		switch (activationType)
		{
		case SPAC_Use:
		case SPAC_Push:
			switch (line->special)
			{
			case Door_Raise:
				if (line->args[0] == 0 && line->args[1] < 64)
					noway = false;
				break;
			case Teleport:
			case Teleport_NoFog:
				noway = false;
			}
			break;

		case SPAC_MCross:
			if (!(lineActivation & SPAC_MCross))
			{
				switch (line->special)
				{
				case Door_Raise:
					if (line->args[1] >= 64)
					{
						break;
					}
				case Teleport:
				case Teleport_NoFog:
				case Teleport_Line:
				case Plat_DownWaitUpStayLip:
				case Plat_DownWaitUpStay:
					noway = false;
				}
			}
			else noway = false;
			break;

		default:
			noway = false;
		}
		return !noway;
	}
	if (activationType == SPAC_MCross && !(lineActivation & SPAC_MCross) &&
		!(line->flags & ML_MONSTERSCANACTIVATE))
	{
		return false;
	}
	return true;
}